

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O1

void raviV_close(lua_State *L)

{
  global_State *pgVar1;
  ravi_State *prVar2;
  
  pgVar1 = L->l_G;
  prVar2 = pgVar1->ravi_state;
  if (prVar2 != (ravi_State *)0x0) {
    if (prVar2->jit != (MIR_context_t)0x0) {
      MIR_finish();
    }
    free(pgVar1->ravi_state);
    return;
  }
  return;
}

Assistant:

void raviV_close(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state == NULL)
    return;
  // All compiled functions will be deleted at this stage
  if (G->ravi_state->jit) {
    MIR_finish(G->ravi_state->jit);
  }
  free(G->ravi_state);
}